

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariterators.h
# Opt level: O1

utf8insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
utf8insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator=(utf8insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,uint32_t x)

{
  int iVar1;
  
  if (x < 0x80) {
    iVar1 = 0;
  }
  else if (x < 0x800) {
    iVar1 = 1;
  }
  else if (x < 0x10000) {
    if ((x & 0xf800) == 0xd800) {
      return this;
    }
    iVar1 = 2;
  }
  else {
    if (0x10ffff < x) {
      return this;
    }
    iVar1 = 3;
  }
  std::__cxx11::string::push_back((char)(this->_p).container);
  if (0x7f < x) {
    do {
      std::__cxx11::string::push_back((char)(this->_p).container);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return this;
}

Assistant:

utf8insert_iterator& operator=(uint32_t x)
    {
        int n;
        uint8_t b;
        if (x<0x80) {
            n=0;
            b=x;
        }
        else if (x<0x800) {
            n=1;
            b=0xc0|(x>>6);
        }
        else if (x<0x10000) {
            if (x>=0xd800 && x<0xe000)
                return *this;
            b=0xe0|(x>>12);
            n=2;
        }
        else if (x<0x110000) {
            b=0xf0|(x>>18);
            n=3;
        }
        else {
            // ignoring invalid value
            return *this;
        }
        *_p++ = b;
        while (n--) {
            b= 0x80 | ((x>>(6*n))&0x3f);
            *_p++ = b;
        }
        return *this;
    }